

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_transfer_bindings(sqlite3_stmt *pFromStmt,sqlite3_stmt *pToStmt)

{
  Vdbe *pTo;
  Vdbe *pFrom;
  sqlite3_stmt *pToStmt_local;
  sqlite3_stmt *pFromStmt_local;
  
  if (*(short *)(pFromStmt + 0x88) == *(short *)(pToStmt + 0x88)) {
    if (((*(ushort *)(pToStmt + 0x9a) >> 9 & 1) != 0) && (*(int *)(pToStmt + 0xf4) != 0)) {
      *(ushort *)(pToStmt + 0x9a) = *(ushort *)(pToStmt + 0x9a) & 0xffdf | 0x20;
    }
    if (((*(ushort *)(pFromStmt + 0x9a) >> 9 & 1) != 0) && (*(int *)(pFromStmt + 0xf4) != 0)) {
      *(ushort *)(pFromStmt + 0x9a) = *(ushort *)(pFromStmt + 0x9a) & 0xffdf | 0x20;
    }
    pFromStmt_local._4_4_ = sqlite3TransferBindings(pFromStmt,pToStmt);
  }
  else {
    pFromStmt_local._4_4_ = 1;
  }
  return pFromStmt_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_transfer_bindings(sqlite3_stmt *pFromStmt, sqlite3_stmt *pToStmt){
  Vdbe *pFrom = (Vdbe*)pFromStmt;
  Vdbe *pTo = (Vdbe*)pToStmt;
  if( pFrom->nVar!=pTo->nVar ){
    return SQLITE_ERROR;
  }
  if( pTo->isPrepareV2 && pTo->expmask ){
    pTo->expired = 1;
  }
  if( pFrom->isPrepareV2 && pFrom->expmask ){
    pFrom->expired = 1;
  }
  return sqlite3TransferBindings(pFromStmt, pToStmt);
}